

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::vector(vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
         *this,size_t count,optional<std::pair<int,_int>_> *value,
        polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_> *alloc)

{
  optional<std::pair<int,_int>_> *poVar1;
  long lVar2;
  size_t sVar3;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (optional<std::pair<int,_int>_> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    lVar2 = 8;
    sVar3 = count;
    do {
      poVar1 = this->ptr;
      (poVar1->optionalValue).__data[lVar2] = value->set;
      if (value->set == true) {
        *(aligned_storage_t<sizeof(std::pair<int,_int>),_alignof(std::pair<int,_int>)> *)
         ((long)poVar1 + lVar2 + -8) = value->optionalValue;
      }
      lVar2 = lVar2 + 0xc;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }